

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O1

void writeTiledRgbaMIP1(char *fileName,int width,int height,int tileWidth,int tileHeight)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int xMax;
  int yMax;
  int level;
  size_t yStride;
  Array2D<Imf_2_5::Rgba> pixels;
  V2f local_50;
  TiledRgbaOutputFile out;
  
  local_50.x = 0.0;
  local_50.y = 0.0;
  iVar1 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaOutputFile::TiledRgbaOutputFile
            (&out,fileName,width,height,tileWidth,tileHeight,MIPMAP_LEVELS,ROUND_DOWN,WRITE_RGBA,1.0
             ,&local_50,1.0,INCREASING_Y,ZIP_COMPRESSION,iVar1);
  pixels._sizeX = (long)height;
  yStride = (size_t)width;
  pixels._sizeY = yStride;
  pixels._data = (Rgba *)operator_new__(-(ulong)(pixels._sizeX * yStride >> 0x3d != 0) |
                                        pixels._sizeX * yStride * 8);
  Imf_2_5::TiledRgbaOutputFile::setFrameBuffer(&out,pixels._data,1,yStride);
  iVar1 = 0;
  while( true ) {
    iVar2 = Imf_2_5::TiledRgbaOutputFile::numLevels(&out);
    if (iVar2 <= iVar1) break;
    iVar2 = Imf_2_5::TiledRgbaOutputFile::levelWidth(&out,iVar1);
    iVar3 = Imf_2_5::TiledRgbaOutputFile::levelHeight(&out,iVar1);
    xMax = Imf_2_5::TiledRgbaOutputFile::levelWidth(&out,iVar1);
    yMax = Imf_2_5::TiledRgbaOutputFile::levelHeight(&out,iVar1);
    drawImage4(&pixels,iVar2,iVar3,0,xMax,0,yMax,iVar1,iVar1);
    iVar2 = Imf_2_5::TiledRgbaOutputFile::numXTiles(&out,iVar1);
    iVar3 = Imf_2_5::TiledRgbaOutputFile::numYTiles(&out,iVar1);
    Imf_2_5::TiledRgbaOutputFile::writeTiles(&out,0,iVar2 + -1,0,iVar3 + -1,iVar1);
    iVar1 = iVar1 + 1;
  }
  if (pixels._data != (Rgba *)0x0) {
    operator_delete__(pixels._data);
  }
  Imf_2_5::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
  return;
}

Assistant:

void
writeTiledRgbaMIP1 (const char fileName[],
                    int width, int height,
                    int tileWidth, int tileHeight)
{
    //
    // Write a tiled image with mipmap levels using an image-sized framebuffer.
    //

    TiledRgbaOutputFile out (fileName,
                             width, height,		// image size
                             tileWidth, tileHeight,	// tile size
                             MIPMAP_LEVELS,		// level mode
			     ROUND_DOWN,		// rounding mode
                             WRITE_RGBA);		// channels in file

    Array2D<Rgba> pixels (height, width);
    out.setFrameBuffer (&pixels[0][0], 1, width);

    for (int level = 0; level < out.numLevels (); ++level)
    {
        drawImage4 (pixels,
		    out.levelWidth (level), out.levelHeight (level),
                    0, out.levelWidth (level),
		    0, out.levelHeight (level),
                    level, level);

	out.writeTiles (0, out.numXTiles (level) - 1,
			0, out.numYTiles (level) - 1,
			level);
    }
}